

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XSDDOMParser::endElement
          (XSDDOMParser *this,XMLElementDecl *elemDecl,uint param_2,bool param_3,XMLCh *param_4)

{
  int iVar1;
  DOMDocumentImpl *pDVar2;
  int iVar3;
  undefined4 extraout_var;
  DOMNode *pDVar4;
  
  if (-1 < this->fAnnotationDepth) {
    iVar3 = this->fInnerAnnotationDepth;
    iVar1 = this->fDepth;
    if (iVar3 == iVar1) {
      this->fInnerAnnotationDepth = -1;
    }
    else {
      if (this->fAnnotationDepth != iVar1) {
        endAnnotationElement(this,elemDecl,false);
        this->fDepth = this->fDepth + -1;
        return;
      }
      this->fAnnotationDepth = -1;
    }
    endAnnotationElement(this,elemDecl,iVar3 != iVar1);
  }
  this->fDepth = this->fDepth + -1;
  pDVar4 = (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentParent;
  (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentNode = pDVar4;
  iVar3 = (*pDVar4->_vptr_DOMNode[5])();
  (this->super_XercesDOMParser).super_AbstractDOMParser.fCurrentParent =
       (DOMNode *)CONCAT44(extraout_var,iVar3);
  pDVar2 = (this->super_XercesDOMParser).super_AbstractDOMParser.fDocument;
  pDVar4 = &(pDVar2->super_DOMDocument).super_DOMNode;
  if (pDVar2 == (DOMDocumentImpl *)0x0) {
    pDVar4 = (DOMNode *)0x0;
  }
  if ((DOMNode *)CONCAT44(extraout_var,iVar3) == pDVar4) {
    (this->super_XercesDOMParser).super_AbstractDOMParser.fWithinElement = false;
  }
  return;
}

Assistant:

void XSDDOMParser::endElement( const XMLElementDecl& elemDecl
                             , const unsigned int
                             , const bool
                             , const XMLCh* const)
{
    if(fAnnotationDepth > -1)
    {
        if (fInnerAnnotationDepth == fDepth)
        {
            fInnerAnnotationDepth = -1;
            endAnnotationElement(elemDecl, false);
	    }
        else if (fAnnotationDepth == fDepth)
        {
            fAnnotationDepth = -1;
            endAnnotationElement(elemDecl, true);
        }
        else
        {   // inside a child of annotation
            endAnnotationElement(elemDecl, false);
            fDepth--;
            return;
        }
    }

    fDepth--;
    fCurrentNode   = fCurrentParent;
    fCurrentParent = fCurrentNode->getParentNode ();

    // If we've hit the end of content, clear the flag.
    //
    if (fCurrentParent == fDocument)
        fWithinElement = false;
}